

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

App * __thiscall CLI::App::_get_fallthrough_parent(App *this)

{
  string *psVar1;
  App *pAVar2;
  HorribleError *this_00;
  App *pAVar3;
  allocator local_39;
  string local_38;
  
  pAVar3 = this->parent_;
  if (this->parent_ == (App *)0x0) {
    this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string((string *)&local_38,"No Valid parent",&local_39);
    HorribleError::HorribleError(this_00,&local_38);
    __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
  }
  do {
    pAVar2 = pAVar3;
    if (pAVar3->parent_ == (App *)0x0) {
      return pAVar2;
    }
    psVar1 = &pAVar3->name_;
    pAVar3 = pAVar3->parent_;
  } while (psVar1->_M_string_length == 0);
  return pAVar2;
}

Assistant:

CLI11_INLINE App *App::_get_fallthrough_parent() {
    if(parent_ == nullptr) {
        throw(HorribleError("No Valid parent"));
    }
    auto *fallthrough_parent = parent_;
    while((fallthrough_parent->parent_ != nullptr) && (fallthrough_parent->get_name().empty())) {
        fallthrough_parent = fallthrough_parent->parent_;
    }
    return fallthrough_parent;
}